

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O1

bool __thiscall cmRST::ProcessFile(cmRST *this,string *fname,bool isModule)

{
  uint uVar1;
  ifstream fin;
  string local_248;
  long local_228 [4];
  uint auStack_208 [122];
  
  std::ifstream::ifstream(local_228,(fname->_M_dataplus)._M_p,_S_in);
  uVar1 = *(uint *)((long)auStack_208 + *(long *)(local_228[0] + -0x18));
  if ((uVar1 & 5) == 0) {
    cmsys::SystemTools::GetFilenamePath(&local_248,fname);
    std::__cxx11::string::operator=((string *)&this->DocDir,(string *)&local_248);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if (isModule) {
      ProcessModule(this,(istream *)local_228);
    }
    else {
      ProcessRST(this,(istream *)local_228);
    }
    this->OutputLinePending = true;
  }
  std::ifstream::~ifstream(local_228);
  return (uVar1 & 5) == 0;
}

Assistant:

bool cmRST::ProcessFile(std::string const& fname, bool isModule)
{
  cmsys::ifstream fin(fname.c_str());
  if (fin) {
    this->DocDir = cmSystemTools::GetFilenamePath(fname);
    if (isModule) {
      this->ProcessModule(fin);
    } else {
      this->ProcessRST(fin);
    }
    this->OutputLinePending = true;
    return true;
  }
  return false;
}